

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

void setup_firstpass_data(AV1_COMMON *cm,FirstPassData *firstpass_data,int unit_rows,int unit_cols)

{
  void *pvVar1;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  long in_RDI;
  int i;
  int j;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  
  pvVar1 = aom_calloc(CONCAT44(in_EDX,in_ECX),
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  in_RSI[1] = (long)pvVar1;
  if (in_RSI[1] == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate firstpass_data->raw_motion_err_list");
  }
  pvVar1 = aom_calloc(CONCAT44(in_EDX,in_ECX),
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  *in_RSI = (long)pvVar1;
  if (*in_RSI == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate firstpass_data->mb_stats");
  }
  for (iVar3 = 0; iVar3 < in_EDX; iVar3 = iVar3 + 1) {
    for (iVar2 = 0; iVar2 < in_ECX; iVar2 = iVar2 + 1) {
      *(undefined4 *)(*in_RSI + (long)(iVar3 * in_ECX + iVar2) * 0x78 + 0x3c) = 0xffffffff;
    }
  }
  return;
}

Assistant:

static void setup_firstpass_data(AV1_COMMON *const cm,
                                 FirstPassData *firstpass_data,
                                 const int unit_rows, const int unit_cols) {
  CHECK_MEM_ERROR(cm, firstpass_data->raw_motion_err_list,
                  aom_calloc(unit_rows * unit_cols,
                             sizeof(*firstpass_data->raw_motion_err_list)));
  CHECK_MEM_ERROR(
      cm, firstpass_data->mb_stats,
      aom_calloc(unit_rows * unit_cols, sizeof(*firstpass_data->mb_stats)));
  for (int j = 0; j < unit_rows; j++) {
    for (int i = 0; i < unit_cols; i++) {
      firstpass_data->mb_stats[j * unit_cols + i].image_data_start_row =
          INVALID_ROW;
    }
  }
}